

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dependent_asyncs.cpp
# Opt level: O0

void iterative_fibonacci(uint W)

{
  code *pcVar1;
  byte extraout_AL;
  int iVar2;
  double __x;
  Expression_lhs<const_unsigned_long_long_&> EVar3;
  ResultBuilder DOCTEST_RB;
  type *fut_1;
  type *t_1;
  type *fut;
  type *t;
  int i;
  unsigned_long_long val_n_2;
  unsigned_long_long val_n_1;
  vector<tf::AsyncTask,_std::allocator<tf::AsyncTask>_> tasks;
  Executor executor;
  nullptr_t in_stack_fffffffffffffce8;
  Result *res;
  pair<tf::AsyncTask,_std::future<int>_> *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  Enum in_stack_fffffffffffffcfc;
  anon_class_16_2_c5eea42a_for__M_fn *in_stack_fffffffffffffd00;
  Executor *in_stack_fffffffffffffd08;
  ResultBuilder *in_stack_fffffffffffffd10;
  Executor *in_stack_fffffffffffffd20;
  ExpressionDecomposer local_2a4;
  anon_class_16_2_c5eea42a_for__M_fn *local_2a0;
  Enum local_298;
  unsigned_long_long *in_stack_fffffffffffffd70;
  Expression_lhs<const_unsigned_long_long_&> *in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  undefined1 local_1d8 [32];
  type *local_1b8;
  int local_1ac;
  undefined4 local_18c;
  undefined8 local_188;
  undefined8 local_180;
  vector<tf::AsyncTask,_std::allocator<tf::AsyncTask>_> local_178 [15];
  
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8)
  ;
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffdd8);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x122cb6);
  std::vector<tf::AsyncTask,_std::allocator<tf::AsyncTask>_>::vector
            ((vector<tf::AsyncTask,_std::allocator<tf::AsyncTask>_> *)0x122cc3);
  local_180 = (Executor *)0x0;
  local_188 = (Executor *)0x0;
  local_18c = 0;
  while( true ) {
    if (0x5c < (int)local_18c) {
      std::vector<tf::AsyncTask,_std::allocator<tf::AsyncTask>_>::~vector
                ((vector<tf::AsyncTask,_std::allocator<tf::AsyncTask>_> *)in_stack_fffffffffffffd00)
      ;
      tf::Executor::~Executor(in_stack_fffffffffffffd20);
      return;
    }
    if ((int)local_18c < 2) {
      local_1ac = local_18c;
      tf::Executor::
      dependent_async<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_dependent_asyncs_cpp:910:48),_nullptr>
                ((Executor *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                 (anon_class_4_1_54a39809_for__M_fn *)in_stack_fffffffffffffcf0);
      local_1b8 = std::get<0ul,tf::AsyncTask,std::future<int>>
                            ((pair<tf::AsyncTask,_std::future<int>_> *)0x122d41);
      local_1d8._24_8_ =
           std::get<1ul,tf::AsyncTask,std::future<int>>
                     ((pair<tf::AsyncTask,_std::future<int>_> *)0x122d53);
      std::vector<tf::AsyncTask,_std::allocator<tf::AsyncTask>_>::push_back
                ((vector<tf::AsyncTask,_std::allocator<tf::AsyncTask>_> *)in_stack_fffffffffffffd00,
                 (value_type *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      local_188 = local_180;
      iVar2 = std::future<int>::get((future<int> *)in_stack_fffffffffffffd10);
      local_180 = SEXT48(iVar2);
      std::pair<tf::AsyncTask,_std::future<int>_>::~pair(in_stack_fffffffffffffcf0);
    }
    else {
      in_stack_fffffffffffffd20 =
           (Executor *)
           std::vector<tf::AsyncTask,_std::allocator<tf::AsyncTask>_>::operator[]
                     (local_178,(long)(local_18c + -1));
      std::vector<tf::AsyncTask,_std::allocator<tf::AsyncTask>_>::operator[]
                (local_178,(long)(local_18c + -2));
      tf::Executor::
      dependent_async<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_dependent_asyncs_cpp:916:48),_tf::AsyncTask_&,_tf::AsyncTask_&,_nullptr>
                (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                 (AsyncTask *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                 &in_stack_fffffffffffffcf0->first);
      in_stack_fffffffffffffd10 = (ResultBuilder *)local_1d8;
      std::get<0ul,tf::AsyncTask,std::future<unsigned_long_long>>
                ((pair<tf::AsyncTask,_std::future<unsigned_long_long>_> *)0x122ead);
      std::get<1ul,tf::AsyncTask,std::future<unsigned_long_long>>
                ((pair<tf::AsyncTask,_std::future<unsigned_long_long>_> *)0x122ebf);
      std::vector<tf::AsyncTask,_std::allocator<tf::AsyncTask>_>::push_back
                ((vector<tf::AsyncTask,_std::allocator<tf::AsyncTask>_> *)in_stack_fffffffffffffd00,
                 (value_type *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      local_188 = local_180;
      in_stack_fffffffffffffd08 =
           (Executor *)
           std::future<unsigned_long_long>::get
                     ((future<unsigned_long_long> *)in_stack_fffffffffffffd10);
      local_180 = in_stack_fffffffffffffd08;
      std::pair<tf::AsyncTask,_std::future<unsigned_long_long>_>::~pair
                ((pair<tf::AsyncTask,_std::future<unsigned_long_long>_> *)in_stack_fffffffffffffcf0)
      ;
    }
    res = (Result *)0x201bd7;
    doctest::detail::ResultBuilder::ResultBuilder
              (in_stack_fffffffffffffd10,(Enum)((ulong)in_stack_fffffffffffffd08 >> 0x20),
               (char *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
               (char *)in_stack_fffffffffffffcf0,"",(char *)in_stack_fffffffffffffd20);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_2a4,DT_REQUIRE);
    EVar3 = doctest::detail::ExpressionDecomposer::operator<<<unsigned_long_long,_nullptr>
                      ((ExpressionDecomposer *)in_stack_fffffffffffffcf0,(unsigned_long_long *)res);
    in_stack_fffffffffffffd00 = (anon_class_16_2_c5eea42a_for__M_fn *)EVar3.lhs;
    in_stack_fffffffffffffcfc = EVar3.m_at;
    local_2a0 = in_stack_fffffffffffffd00;
    local_298 = in_stack_fffffffffffffcfc;
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
              (&fibonacci,(long)(int)local_18c);
    doctest::detail::Expression_lhs<const_unsigned_long_long_&>::
    operator==<unsigned_long_long,_nullptr>(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffffcf0,res);
    doctest::detail::Result::~Result((Result *)0x12301e);
    doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffd90,__x);
    in_stack_fffffffffffffcf8 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffffcf8);
    if ((extraout_AL & 1) != 0) break;
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffffcf0);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1230eb);
    local_18c = local_18c + 1;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void iterative_fibonacci(unsigned W) {

  tf::Executor executor(W);
  
  std::vector<tf::AsyncTask> tasks;
  
  unsigned long long int val_n_1 = 0, val_n_2 = 0;

  for (int i = 0; i <= 92; ++i) {
    if (i < 2) {
      auto [t, fut] = executor.dependent_async([i](){ return i; });
      tasks.push_back(t);
      val_n_2 = val_n_1;
      val_n_1 = fut.get();
    }
    else {
      auto [t, fut] = executor.dependent_async([val_n_1, val_n_2](){
        return val_n_2 + val_n_1;
      }, tasks[i-1], tasks[i-2]);
      
      tasks.push_back(t);
      val_n_2 = val_n_1;
      val_n_1 = fut.get();
    }
    REQUIRE(val_n_1 == fibonacci[i]);  
  }
}